

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::UniDirectionalLSTMLayerParams::UniDirectionalLSTMLayerParams
          (UniDirectionalLSTMLayerParams *this)

{
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__UniDirectionalLSTMLayerParams_003d51a8;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->activations_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->activations_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->activations_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->activations_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  if (this != (UniDirectionalLSTMLayerParams *)&_UniDirectionalLSTMLayerParams_default_instance_) {
    protobuf_NeuralNetwork_2eproto::InitDefaults();
  }
  this->inputvectorsize_ = 0;
  this->outputvectorsize_ = 0;
  this->params_ = (LSTMParams *)0x0;
  this->weightparams_ = (LSTMWeightParams *)0x0;
  this->reverseinput_ = false;
  this->_cached_size_ = 0;
  return;
}

Assistant:

UniDirectionalLSTMLayerParams::UniDirectionalLSTMLayerParams()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_NeuralNetwork_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.UniDirectionalLSTMLayerParams)
}